

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::schema::Node::Builder::initConst(Builder *__return_storage_ptr__,Builder *this)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  WirePointer *pWVar3;
  StructPointerCount SVar4;
  undefined2 uVar5;
  PointerBuilder local_38;
  
  *(undefined2 *)((long)(this->_builder).data + 0xc) = 4;
  local_38.pointer = (this->_builder).pointers + 3;
  local_38.segment = (this->_builder).segment;
  local_38.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::clear(&local_38);
  local_38.pointer = (this->_builder).pointers + 4;
  local_38.segment = (this->_builder).segment;
  local_38.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::clear(&local_38);
  SVar4 = (this->_builder).pointerCount;
  uVar5 = *(undefined2 *)&(this->_builder).field_0x26;
  (__return_storage_ptr__->_builder).dataSize = (this->_builder).dataSize;
  (__return_storage_ptr__->_builder).pointerCount = SVar4;
  *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = uVar5;
  pSVar1 = (this->_builder).segment;
  pCVar2 = (this->_builder).capTable;
  pWVar3 = (this->_builder).pointers;
  (__return_storage_ptr__->_builder).data = (this->_builder).data;
  (__return_storage_ptr__->_builder).pointers = pWVar3;
  (__return_storage_ptr__->_builder).segment = pSVar1;
  (__return_storage_ptr__->_builder).capTable = pCVar2;
  return __return_storage_ptr__;
}

Assistant:

inline typename Node::Const::Builder Node::Builder::initConst() {
  _builder.setDataField<Node::Which>(
      ::capnp::bounded<6>() * ::capnp::ELEMENTS, Node::CONST);
  _builder.getPointerField(::capnp::bounded<3>() * ::capnp::POINTERS).clear();
  _builder.getPointerField(::capnp::bounded<4>() * ::capnp::POINTERS).clear();
  return typename Node::Const::Builder(_builder);
}